

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

void __thiscall Plane::Plane(Plane *this,double a,double b,double c,double d)

{
  double v;
  double norm;
  double local_30;
  double d_local;
  double c_local;
  double b_local;
  double a_local;
  Plane *this_local;
  
  local_30 = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (double)this;
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__Plane_0010fae0;
  Vector::Vector(&this->normal);
  Vector::Vector((Vector *)&norm,b_local,c_local,d_local);
  Vector::operator=(&this->normal,(Vector *)&norm);
  v = Vector::operator!(&this->normal);
  Vector::operator/=(&this->normal,v);
  this->dist = local_30 / v;
  return;
}

Assistant:

Plane::Plane( double a, double b, double c,  double d )
{
   normal = Vector(a,b,c);
   double norm = !normal;

   normal /= norm;
   dist = d / norm;
}